

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O0

void __thiscall QPDFLogger::Members::Members(Members *this)

{
  Pl_Discard *this_00;
  Pl_OStream *pPVar1;
  Pl_Track *this_01;
  element_type *next;
  Members *this_local;
  
  this_00 = (Pl_Discard *)operator_new(0x30);
  Pl_Discard::Pl_Discard(this_00);
  std::shared_ptr<Pipeline>::shared_ptr<Pl_Discard,void>(&this->p_discard,this_00);
  pPVar1 = (Pl_OStream *)operator_new(0x38);
  Pl_OStream::Pl_OStream(pPVar1,"standard output",(ostream *)&std::cout);
  std::shared_ptr<Pipeline>::shared_ptr<Pl_OStream,void>(&this->p_real_stdout,pPVar1);
  this_01 = (Pl_Track *)operator_new(0x38);
  next = std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::get
                   (&(this->p_real_stdout).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>)
  ;
  anon_unknown.dwarf_33f38f::Pl_Track::Pl_Track(this_01,"track stdout",next);
  std::shared_ptr<Pipeline>::shared_ptr<(anonymous_namespace)::Pl_Track,void>
            (&this->p_stdout,this_01);
  pPVar1 = (Pl_OStream *)operator_new(0x38);
  Pl_OStream::Pl_OStream(pPVar1,"standard error",(ostream *)&std::cerr);
  std::shared_ptr<Pipeline>::shared_ptr<Pl_OStream,void>(&this->p_stderr,pPVar1);
  std::shared_ptr<Pipeline>::shared_ptr(&this->p_info,&this->p_stdout);
  std::shared_ptr<Pipeline>::shared_ptr(&this->p_warn,(nullptr_t)0x0);
  std::shared_ptr<Pipeline>::shared_ptr(&this->p_error,&this->p_stderr);
  std::shared_ptr<Pipeline>::shared_ptr(&this->p_save,(nullptr_t)0x0);
  return;
}

Assistant:

QPDFLogger::Members::Members() :
    p_discard(new Pl_Discard()),
    p_real_stdout(new Pl_OStream("standard output", std::cout)),
    p_stdout(new Pl_Track("track stdout", p_real_stdout.get())),
    p_stderr(new Pl_OStream("standard error", std::cerr)),
    p_info(p_stdout),
    p_warn(nullptr),
    p_error(p_stderr),
    p_save(nullptr)
{
}